

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

FArrayBox * amrex::VisMF::readFAB(int idx,string *mf_name,Header *hdr,int whichComp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  BaseFab<double> *this;
  ifstream *is;
  double *out;
  RealDescriptor *pRVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  RealDescriptor *this_00;
  int iVar9;
  string FullName;
  string local_98;
  Box local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar8 = (long)idx;
  BATransformer::operator()
            (&local_78,&(hdr->m_ba).m_bat,
             (Box *)(lVar8 * 0x1c +
                    *(long *)&(((hdr->m_ba).m_ref.
                                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data));
  iVar7 = (hdr->m_ngrow).vect[0];
  uVar2 = *(undefined8 *)((hdr->m_ngrow).vect + 1);
  iVar4 = (int)uVar2;
  iVar9 = (int)((ulong)uVar2 >> 0x20);
  iVar6 = iVar4;
  if (iVar4 < iVar7) {
    iVar6 = iVar7;
  }
  if (iVar6 <= iVar9) {
    iVar6 = iVar9;
  }
  if (0 < iVar6) {
    local_78.bigend.vect[0] = iVar7 + local_78.bigend.vect[0];
    local_78.smallend.vect[0] = local_78.smallend.vect[0] - iVar7;
    local_78.smallend.vect[1] = local_78.smallend.vect[1] - iVar4;
    local_78.smallend.vect[2] = local_78.smallend.vect[2] - iVar9;
    iVar7 = local_78.bigend.vect[2];
    local_78.bigend.vect[1] = local_78.bigend.vect[1] + iVar4;
    local_78.bigend.vect[2] = iVar7 + iVar9;
  }
  this = (BaseFab<double> *)operator_new(0x48);
  iVar7 = 1;
  if (whichComp == -1) {
    iVar7 = hdr->m_ncomp;
  }
  FArrayBox::FArrayBox((FArrayBox *)this,&local_78,iVar7,true,false,(Arena *)0x0);
  DirName(&local_98,mf_name);
  std::__cxx11::string::_M_append
            ((char *)&local_98,
             *(ulong *)&(hdr->m_fod).
                        super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                        .
                        super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar8].m_name._M_dataplus);
  is = OpenStream(&local_98);
  std::istream::seekg((long)is,(_Ios_Seekdir)
                               (hdr->m_fod).
                               super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                               .
                               super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar8].m_head);
  if (hdr->m_vers == 1) {
    if (whichComp == -1) {
      FArrayBox::readFrom((FArrayBox *)this,(istream *)is);
    }
    else {
      FArrayBox::readFrom((FArrayBox *)this,(istream *)is,whichComp);
    }
  }
  else {
    out = BaseFab<double>::dataPtr(this,0);
    if (whichComp == -1) {
      pRVar5 = FPC::NativeRealDescriptor();
      bVar3 = RealDescriptor::operator==(&hdr->m_writtenRD,pRVar5);
      if (bVar3) {
        std::istream::read((char *)is,(long)out);
      }
      else {
        uVar2 = *(undefined8 *)(this->domain).bigend.vect;
        uVar1 = *(undefined8 *)(this->domain).smallend.vect;
        RealDescriptor::convertToNativeFormat
                  (out,(long)this->nvar *
                       (long)(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) + 1) *
                       (long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1)
                       * (long)(((int)uVar2 - (int)uVar1) + 1),(istream *)is,&hdr->m_writtenRD);
      }
    }
    else {
      local_48 = *(undefined8 *)(this->domain).bigend.vect;
      uStack_40 = 0;
      local_58 = *(undefined8 *)(this->domain).smallend.vect;
      uStack_50 = 0;
      iVar7 = (this->domain).smallend.vect[2];
      iVar6 = (this->domain).bigend.vect[2];
      this_00 = &hdr->m_writtenRD;
      iVar4 = RealDescriptor::numBytes(this_00);
      std::istream::seekg((long)is,whichComp *
                                   iVar4 * ((local_48._4_4_ - local_58._4_4_) + 1) *
                                   ((iVar6 - iVar7) + 1) * (((int)local_48 - (int)local_58) + 1));
      pRVar5 = FPC::NativeRealDescriptor();
      bVar3 = RealDescriptor::operator==(this_00,pRVar5);
      if (bVar3) {
        std::istream::read((char *)is,(long)out);
      }
      else {
        uVar2 = *(undefined8 *)(this->domain).bigend.vect;
        uVar1 = *(undefined8 *)(this->domain).smallend.vect;
        RealDescriptor::convertToNativeFormat
                  (out,(long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1)
                       * (long)(((int)uVar2 - (int)uVar1) + 1) *
                       (long)(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) + 1),
                   (istream *)is,this_00);
      }
    }
  }
  CloseStream(&local_98,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return (FArrayBox *)this;
}

Assistant:

FArrayBox*
VisMF::readFAB (int                  idx,
                const std::string   &mf_name,
                const VisMF::Header &hdr,
                int                  whichComp)
{
//    BL_PROFILE("VisMF::readFAB_idx");
    Box fab_box(hdr.m_ba[idx]);
    if(hdr.m_ngrow.max() > 0) {
        fab_box.grow(hdr.m_ngrow);
    }

    FArrayBox *fab = new FArrayBox(fab_box, whichComp == -1 ? hdr.m_ncomp : 1);

    std::string FullName(VisMF::DirName(mf_name));
    FullName += hdr.m_fod[idx].m_name;

    std::ifstream *infs = VisMF::OpenStream(FullName);
    infs->seekg(hdr.m_fod[idx].m_head, std::ios::beg);

    if(hdr.m_vers == Header::Version_v1) {
      if(whichComp == -1) {    // ---- read all components
        fab->readFrom(*infs);
      } else {
        fab->readFrom(*infs, whichComp);
      }
    } else {
      Real* fabdata = fab->dataPtr();
#ifdef AMREX_USE_GPU
      std::unique_ptr<FArrayBox> hostfab;
      if (fab->arena()->isManaged() || fab->arena()->isDevice()) {
          hostfab = std::make_unique<FArrayBox>(fab->box(), fab->nComp(), The_Pinned_Arena());
          fabdata = hostfab->dataPtr();
      }
#endif
      if(whichComp == -1) {    // ---- read all components
        if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
          infs->read((char *) fabdata, fab->nBytes());
        } else {
          Long readDataItems(fab->box().numPts() * fab->nComp());
          RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                                *infs, hdr.m_writtenRD);
        }

      } else {
        Long bytesPerComp(fab->box().numPts() * hdr.m_writtenRD.numBytes());
        infs->seekg(bytesPerComp * whichComp, std::ios::cur);
        if(hdr.m_writtenRD == FPC::NativeRealDescriptor()) {
          infs->read((char *) fabdata, bytesPerComp);
        } else {
          Long readDataItems(fab->box().numPts());  // ---- one component only
          RealDescriptor::convertToNativeFormat(fabdata, readDataItems,
                                                *infs, hdr.m_writtenRD);
        }
      }
#ifdef AMREX_USE_GPU
      if (hostfab) {
          Gpu::htod_memcpy_async(fab->dataPtr(), hostfab->dataPtr(), fab->size()*sizeof(Real));
          Gpu::streamSynchronize();
      }
#endif
    }

    VisMF::CloseStream(FullName);

    return fab;
}